

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.c
# Opt level: O0

HT_ErrorCode ht_timeline_set_feature(HT_Timeline *timeline,HT_Feature *feature)

{
  HT_ErrorCode local_1c;
  HT_ErrorCode error_code;
  HT_Feature *feature_local;
  HT_Timeline *timeline_local;
  
  if (feature == (HT_Feature *)0x0) {
    __assert_fail("feature",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                  ,0x7b,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
  }
  if (feature->klass == (HT_FeatureKlass *)0x0) {
    __assert_fail("feature->klass",
                  "/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/lib/timeline.c"
                  ,0x7c,"HT_ErrorCode ht_timeline_set_feature(HT_Timeline *, HT_Feature *)");
  }
  local_1c = HT_ERR_OK;
  if ((feature->klass->id == 0xffffffff) || (0x1f < feature->klass->id)) {
    local_1c = HT_ERR_FEATURE_NOT_REGISTERED;
  }
  else if (timeline->features[feature->klass->id] == (HT_Feature *)0x0) {
    timeline->features[feature->klass->id] = feature;
  }
  else {
    local_1c = HT_ERR_FEATURE_ALREADY_REGISTERED;
  }
  if (local_1c != HT_ERR_OK) {
    (*feature->klass->destroy)(feature);
  }
  return local_1c;
}

Assistant:

HT_ErrorCode
ht_timeline_set_feature(HT_Timeline* timeline, HT_Feature* feature)
{
    assert(feature);
    assert(feature->klass);

    HT_ErrorCode error_code = HT_ERR_OK;

    if (feature->klass->id == HT_INVALID_FEATURE_ID || feature->klass->id >= HT_TIMELINE_MAX_FEATURES)
    {
        error_code = HT_ERR_FEATURE_NOT_REGISTERED;
    }
    else if (timeline->features[feature->klass->id])
    {
        error_code = HT_ERR_FEATURE_ALREADY_REGISTERED;
    }
    else
    {
        timeline->features[feature->klass->id] = feature;
    }

    if (error_code != HT_ERR_OK)
    {
        feature->klass->destroy(feature);
    }

    return error_code;
}